

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O2

void prometheus::Gateway::CleanupStalePointers
               (vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *collectables)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  long lVar3;
  const_iterator cVar4;
  const_iterator __last;
  pointer ppVar5;
  type ppVar6;
  type __p;
  
  ppVar5 = (collectables->
           super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (collectables->
       super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)__last._M_current - (long)ppVar5;
  for (lVar2 = lVar3 / 0x30 >> 2; cVar4._M_current = ppVar5, 0 < lVar2; lVar2 = lVar2 + -1) {
    p_Var1 = (ppVar5->first).super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var1->_M_use_count == 0)) goto LAB_00106c1b;
    p_Var1 = ppVar5[1].first.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var1->_M_use_count == 0)) {
      cVar4._M_current = ppVar5 + 1;
      goto LAB_00106c1b;
    }
    p_Var1 = ppVar5[2].first.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var1->_M_use_count == 0)) {
      cVar4._M_current = ppVar5 + 2;
      goto LAB_00106c1b;
    }
    p_Var1 = ppVar5[3].first.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var1->_M_use_count == 0)) {
      cVar4._M_current = ppVar5 + 3;
      goto LAB_00106c1b;
    }
    ppVar5 = ppVar5 + 4;
    lVar3 = lVar3 + -0xc0;
  }
  lVar3 = lVar3 / 0x30;
  if (lVar3 == 1) {
LAB_00106cb9:
    p_Var1 = (ppVar5->first).super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    cVar4._M_current = ppVar5;
    if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (p_Var1->_M_use_count != 0)) {
      cVar4._M_current = __last._M_current;
    }
  }
  else if (lVar3 == 2) {
LAB_00106c9d:
    p_Var1 = (ppVar5->first).super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    cVar4._M_current = ppVar5;
    if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (p_Var1->_M_use_count != 0)) {
      ppVar5 = ppVar5 + 1;
      goto LAB_00106cb9;
    }
  }
  else {
    cVar4._M_current = __last._M_current;
    if (lVar3 != 3) goto LAB_00106c56;
    p_Var1 = (ppVar5->first).super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    cVar4._M_current = ppVar5;
    if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (p_Var1->_M_use_count != 0)) {
      ppVar5 = ppVar5 + 1;
      goto LAB_00106c9d;
    }
  }
LAB_00106c1b:
  ppVar6 = cVar4._M_current;
  if (cVar4._M_current != __last._M_current) {
    while (__p = ppVar6 + 1, __p != __last._M_current) {
      p_Var1 = ppVar6[1].first.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      ppVar6 = __p;
      if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (p_Var1->_M_use_count != 0)) {
        ::std::
        pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(cVar4._M_current,__p);
        cVar4._M_current = cVar4._M_current + 1;
      }
    }
    __last._M_current =
         (collectables->
         super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
LAB_00106c56:
  ::std::
  vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase(collectables,cVar4,__last);
  return;
}

Assistant:

void Gateway::CleanupStalePointers(
    std::vector<CollectableEntry>& collectables) {
  collectables.erase(
      std::remove_if(std::begin(collectables), std::end(collectables),
                     [](const CollectableEntry& candidate) {
                       return candidate.first.expired();
                     }),
      std::end(collectables));
}